

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DefaultRowEst(Index *pIdx)

{
  short *psVar1;
  long in_RDI;
  int i;
  int nCopy;
  LogEst *a;
  LogEst aVal [5];
  uint local_2c;
  uint local_28;
  undefined8 local_12;
  undefined2 local_a;
  long local_8;
  
  local_12 = 0x1c001e00200021;
  local_a = 0x1a;
  psVar1 = *(short **)(in_RDI + 0x10);
  if (*(ushort *)(in_RDI + 0x56) < 6) {
    local_2c = (uint)*(ushort *)(in_RDI + 0x56);
  }
  else {
    local_2c = 5;
  }
  *psVar1 = *(short *)(*(long *)(in_RDI + 0x18) + 0x38);
  if (*psVar1 < 0x21) {
    *psVar1 = 0x21;
  }
  local_8 = in_RDI;
  memcpy(psVar1 + 1,&local_12,(long)(int)local_2c << 1);
  while (local_28 = local_2c + 1, (int)local_28 <= (int)(uint)*(ushort *)(local_8 + 0x56)) {
    psVar1[(int)local_28] = 0x17;
    local_2c = local_28;
  }
  if (*(char *)(local_8 + 0x5a) != '\0') {
    psVar1[*(ushort *)(local_8 + 0x56)] = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DefaultRowEst(Index *pIdx){
  /*                10,  9,  8,  7,  6 */
  LogEst aVal[] = { 33, 32, 30, 28, 26 };
  LogEst *a = pIdx->aiRowLogEst;
  int nCopy = MIN(ArraySize(aVal), pIdx->nKeyCol);
  int i;

  /* Set the first entry (number of rows in the index) to the estimated 
  ** number of rows in the table. Or 10, if the estimated number of rows 
  ** in the table is less than that.  */
  a[0] = pIdx->pTable->nRowLogEst;
  if( a[0]<33 ) a[0] = 33;        assert( 33==sqlite3LogEst(10) );

  /* Estimate that a[1] is 10, a[2] is 9, a[3] is 8, a[4] is 7, a[5] is
  ** 6 and each subsequent value (if any) is 5.  */
  memcpy(&a[1], aVal, nCopy*sizeof(LogEst));
  for(i=nCopy+1; i<=pIdx->nKeyCol; i++){
    a[i] = 23;                    assert( 23==sqlite3LogEst(5) );
  }

  assert( 0==sqlite3LogEst(1) );
  if( IsUniqueIndex(pIdx) ) a[pIdx->nKeyCol] = 0;
}